

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

DReachabilityPropagator *
dreachable(int r,vec<BoolView> *_vs,vec<BoolView> *_es,vec<vec<int>_> *_in,vec<vec<int>_> *_out,
          vec<vec<int>_> *_en,BoolView b)

{
  BoolView _b;
  DReachabilityPropagatorReif *this;
  undefined8 in_stack_ffffffffffffffa8;
  undefined **local_40;
  undefined4 local_38;
  undefined1 local_34;
  
  this = (DReachabilityPropagatorReif *)operator_new(0x1d8);
  local_40 = &PTR_finished_001efbb8;
  local_38 = *(undefined4 *)((long)b.super_Var.super_Branching._vptr_Branching + 8);
  local_34 = *(undefined1 *)((long)b.super_Var.super_Branching._vptr_Branching + 0xc);
  _b.v = (int)in_stack_ffffffffffffffa8;
  _b.s = (bool)(char)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  _b._13_3_ = (int3)((ulong)in_stack_ffffffffffffffa8 >> 0x28);
  _b.super_Var.super_Branching._vptr_Branching = (Branching)(Branching)&local_40;
  DReachabilityPropagatorReif::DReachabilityPropagatorReif(this,r,_vs,_es,_in,_out,_en,_b);
  return &this->super_DReachabilityPropagator;
}

Assistant:

DReachabilityPropagator* dreachable(int r, vec<BoolView>& _vs, vec<BoolView>& _es,
																		vec<vec<edge_id> >& _in, vec<vec<edge_id> >& _out,
																		vec<vec<int> >& _en, BoolView b) {
	DReachabilityPropagator* dr =
			new DReachabilityPropagatorReif(r, _vs, _es, _in, _out, _en, std::move(b));
	// if (so.check_prop)
	//     engine.propagators.push(dr);
	return dr;
}